

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPyramid>::ClassId(TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TPZGeoPyramid *in_RDI;
  string *in_stack_ffffffffffffff90;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  TPZGeoPyramid *in_stack_ffffffffffffffc0;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  uVar1 = Hash(in_stack_ffffffffffffff90);
  iVar2 = TPZGeoEl::ClassId((TPZGeoEl *)0x15f78ad);
  pzgeom::TPZGeoPyramid::TPZGeoPyramid(in_RDI);
  iVar3 = pzgeom::TPZGeoPyramid::ClassId(in_stack_ffffffffffffffc0);
  pzgeom::TPZGeoPyramid::~TPZGeoPyramid((TPZGeoPyramid *)0x15f78fa);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}